

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.h
# Opt level: O2

int64_t __thiscall aeron::ClientConductor::channelStatus(ClientConductor *this,int32_t counterId)

{
  int64_t iVar1;
  
  if (counterId == 0) {
    return 0;
  }
  if (counterId == -1) {
    return 1;
  }
  iVar1 = concurrent::CountersReader::getCounterValue(&this->m_countersReader,counterId);
  return iVar1;
}

Assistant:

inline std::int64_t channelStatus(std::int32_t counterId) const
    {
        switch (counterId)
        {
            case 0:
                return ChannelEndpointStatus::CHANNEL_ENDPOINT_INITIALIZING;

            case ChannelEndpointStatus::NO_ID_ALLOCATED:
                return ChannelEndpointStatus::CHANNEL_ENDPOINT_ACTIVE;

            default:
                return m_countersReader.getCounterValue(counterId);
        }
    }